

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusStencilOp::emulate_mthd(MthdCelsiusStencilOp *this)

{
  pgraph_state *state;
  uint32_t uVar1;
  byte bVar2;
  uint val;
  uint32_t err;
  long lStack_20;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  switch(uVar1) {
  case 0x1e00:
    lStack_20 = 1;
    break;
  case 0x1e01:
    lStack_20 = 3;
    break;
  case 0x1e02:
    lStack_20 = 4;
    break;
  case 0x1e03:
    lStack_20 = 5;
    break;
  default:
    if (uVar1 == 0) {
      lStack_20 = 2;
    }
    else if (uVar1 == 0x8508) {
      lStack_20 = 8;
    }
    else if (uVar1 == 0x8507) {
      lStack_20 = 7;
    }
    else {
      if (uVar1 != 0x150a) {
        err = err | 1;
        goto LAB_001e1ce4;
      }
      lStack_20 = 6;
    }
  }
  if (err == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) != 0) {
      return;
    }
    bVar2 = (char)this->which << 2;
    val = (uint)(lStack_20 << (bVar2 & 0x3f)) |
          ~(uint)(0xfL << (bVar2 & 0x3f)) &
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b = val;
    pgraph_celsius_icmd(state,0x1e,val,true);
    return;
  }
LAB_001e1ce4:
  MthdTest::warn((MthdTest *)this,err);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0:
				rv = 2;
				break;
			case 0x150a:
				rv = 6;
				break;
			case 0x1e00:
				rv = 1;
				break;
			case 0x1e01:
				rv = 3;
				break;
			case 0x1e02:
				rv = 4;
				break;
			case 0x1e03:
				rv = 5;
				break;
			case 0x8507:
				rv = 7;
				break;
			case 0x8508:
				rv = 8;
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_stencil_b, 4 * which, 4, rv);
				pgraph_celsius_icmd(&exp, 0x1e, exp.bundle_stencil_b, true);
			}
		}
	}